

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ootake_PSG.c
# Opt level: O0

void OPSG_SetMuteMask(void *chip,UINT32 MuteMask)

{
  undefined1 local_15;
  Uint8 CurChn;
  UINT32 MuteMask_local;
  void *chip_local;
  
  for (local_15 = 0; local_15 < 6; local_15 = local_15 + 1) {
    OPSG_SetMutePsgChannel(chip,local_15,(byte)(MuteMask >> (local_15 & 0x1f)) & 1);
  }
  return;
}

Assistant:

static void OPSG_SetMuteMask(void* chip, UINT32 MuteMask)
{
	Uint8 CurChn;
	
	for (CurChn = 0; CurChn < N_CHANNEL; CurChn ++)
		OPSG_SetMutePsgChannel(chip, CurChn, (MuteMask >> CurChn) & 0x01);
	
	return;
}